

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O2

string * __thiscall
CLParam<int>::getFullParamName_abi_cxx11_(string *__return_storage_ptr__,CLParam<int> *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"-",(allocator *)&bStack_78);
  std::operator+(__return_storage_ptr__,&local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 8));
  std::__cxx11::string::~string((string *)&local_58);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&bStack_78);
  if ('\n' < (char)this[0x28]) {
    getShortParamNameStr_abi_cxx11_(&local_38,this);
    std::operator+(&bStack_78,&local_38,", -");
    std::operator+(&local_58,&bStack_78,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&bStack_78);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getFullParamName()
    {
        std::string fullname = std::string("-")+parameter_name ;
        if (parameter_name_short > 10) {
            fullname = getShortParamNameStr()+", -"+fullname ;
        }
        return fullname ;
    }